

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSTSHarness.cpp
# Opt level: O0

void __thiscall BaseHarnessHandlers::printFile(BaseHarnessHandlers *this,XMLURL *url)

{
  bool bVar1;
  int iVar2;
  XMLCh *pXVar3;
  ostream *poVar4;
  long lVar5;
  ulong uStack_158;
  int cr;
  XMLSize_t idx;
  XMLSize_t nRead;
  XMLByte buffer [256];
  StrX local_40 [3];
  StrX local_28;
  long *local_20;
  BinInputStream *stream;
  XMLURL *url_local;
  BaseHarnessHandlers *this_local;
  
  stream = (BinInputStream *)url;
  url_local = (XMLURL *)this;
  pXVar3 = xercesc_4_0::XMLURL::getURLText(url);
  bVar1 = xercesc_4_0::XMLString::equals(pXVar3,L"file://dummy/");
  if (!bVar1) {
    local_20 = (long *)xercesc_4_0::XMLURL::makeNewStream();
    if (local_20 == (long *)0x0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"File ");
      pXVar3 = xercesc_4_0::XMLURL::getURLText((XMLURL *)stream);
      StrX::StrX(&local_28,pXVar3);
      poVar4 = operator<<(poVar4,&local_28);
      poVar4 = std::operator<<(poVar4," is missing");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(&local_28);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Content of file ");
      pXVar3 = xercesc_4_0::XMLURL::getURLText((XMLURL *)stream);
      StrX::StrX(local_40,pXVar3);
      poVar4 = operator<<(poVar4,local_40);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      StrX::~StrX(local_40);
      while (lVar5 = (**(code **)(*local_20 + 0x18))(local_20,&nRead,0xff), lVar5 != 0) {
        buffer[lVar5 + -8] = '\0';
        uStack_158 = 0;
        do {
          iVar2 = xercesc_4_0::XMLString::indexOf
                            ((char *)&nRead,'\r',uStack_158,
                             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          if (iVar2 == -1) break;
          lVar5 = xercesc_4_0::XMLString::stringLen((char *)(buffer + (long)(iVar2 + 1) + -8));
          memmove(buffer + (long)iVar2 + -8,buffer + (long)(iVar2 + 1) + -8,lVar5 + 1);
          uStack_158 = (ulong)iVar2;
        } while (buffer[uStack_158 - 8] != '\0');
        std::operator<<((ostream *)&std::cout,(char *)&nRead);
      }
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      if (local_20 != (long *)0x0) {
        (**(code **)(*local_20 + 8))();
      }
    }
  }
  return;
}

Assistant:

void BaseHarnessHandlers::printFile(XMLURL& url)
{
    if(XMLString::equals(url.getURLText(), dummy))
        return;
    BinInputStream* stream=url.makeNewStream();
    if(stream==NULL)
    {
        std::cout << "File " << StrX(url.getURLText()) << " is missing" << std::endl;
        return;
    }
    std::cout << "Content of file " << StrX(url.getURLText()) << std::endl;
    XMLByte buffer[256];
    XMLSize_t nRead;
    while((nRead=stream->readBytes(buffer, 255)) >0)
    {
        buffer[nRead]=0;
        // sending data containing \n\r to cout generates \n\n\r, so strip any \r
        XMLSize_t idx=0;
        while(true)
        {
            int cr=XMLString::indexOf((const char*)buffer, '\r', idx);
            if(cr==-1)
                break;
            memmove(&buffer[cr], &buffer[cr+1], XMLString::stringLen((const char*)&buffer[cr+1])+1);
            idx=cr;
            if(buffer[idx]==0)
                break;
        }
        std::cout << (const char*)buffer;
    }
    std::cout << std::endl;
    delete stream;
}